

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZBlock::TNode>::Resize(TPZVec<TPZBlock::TNode> *this,int64_t newsize,TNode *object)

{
  undefined8 uVar1;
  int64_t *piVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  TNode *pTVar6;
  long lVar7;
  int *piVar8;
  TNode *pTVar9;
  bool bVar10;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    return;
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      pTVar9 = (TNode *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize * 0x10 | 8)
      ;
      *piVar2 = newsize;
      pTVar9 = (TNode *)(piVar2 + 1);
      pTVar6 = pTVar9;
      do {
        (pTVar6->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TNode_016a5b68;
        pTVar6->pos = 0;
        pTVar6->dim = 0;
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != (TNode *)(piVar2 + newsize * 2 + 1));
    }
    if (newsize <= lVar5) {
      lVar5 = newsize;
    }
    pTVar6 = this->fStore;
    lVar4 = 0;
    if (0 < lVar5) {
      lVar4 = lVar5;
    }
    lVar5 = 8;
    lVar7 = lVar4;
    while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
      *(undefined8 *)((long)&(pTVar9->super_TPZSavable)._vptr_TPZSavable + lVar5) =
           *(undefined8 *)((long)&(pTVar6->super_TPZSavable)._vptr_TPZSavable + lVar5);
      lVar5 = lVar5 + 0x10;
    }
    uVar1 = *(undefined8 *)&object->pos;
    piVar8 = &pTVar9[lVar4].pos;
    for (; lVar4 < newsize; lVar4 = lVar4 + 1) {
      *(undefined8 *)piVar8 = uVar1;
      piVar8 = piVar8 + 4;
    }
    if (pTVar6 != (TNode *)0x0) {
      lVar5._0_4_ = pTVar6[-1].pos;
      lVar5._4_4_ = pTVar6[-1].dim;
      operator_delete__(&pTVar6[-1].pos,lVar5 << 4 | 8);
    }
    this->fStore = pTVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}